

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManIsoStrashReduce(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Wec_t *vSupps;
  Vec_Wec_t *__ptr;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Gia_Man_t *pGVar6;
  Vec_Ptr_t *pVVar7;
  void **__ptr_00;
  void *pvVar8;
  uint uVar9;
  int fVerbose_00;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  vSupps = Gia_ManCreateCoSupps(p,fVerbose);
  __ptr = Gia_ManIsoStrashReduceInt(p,vSupps,fVerbose_00);
  uVar1 = __ptr->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar9 = uVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar9;
  if (uVar9 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)(int)uVar9 << 2);
  }
  pVVar4->pArray = piVar5;
  if (0 < (int)uVar1) {
    pVVar3 = __ptr->pArray;
    lVar12 = 0;
    do {
      if (0 < *(int *)((long)&pVVar3->nSize + lVar12)) {
        Vec_IntPush(pVVar4,**(int **)((long)&pVVar3->pArray + lVar12));
      }
      lVar12 = lVar12 + 0x10;
    } while ((ulong)uVar1 << 4 != lVar12);
  }
  piVar5 = pVVar4->pArray;
  pGVar6 = Gia_ManDupCones(p,piVar5,pVVar4->nSize,0);
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    pVVar4->pArray = (int *)0x0;
  }
  free(pVVar4);
  iVar2 = vSupps->nCap;
  if (0 < (long)iVar2) {
    pVVar4 = vSupps->pArray;
    lVar12 = 0;
    do {
      pvVar8 = *(void **)((long)&pVVar4->pArray + lVar12);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
        *(undefined8 *)((long)&pVVar4->pArray + lVar12) = 0;
      }
      lVar12 = lVar12 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar12);
  }
  if (vSupps->pArray != (Vec_Int_t *)0x0) {
    free(vSupps->pArray);
    vSupps->pArray = (Vec_Int_t *)0x0;
  }
  vSupps->nCap = 0;
  vSupps->nSize = 0;
  free(vSupps);
  if ((fVerbose != 0) && (puts("Nontrivial classes:"), 0 < (int)uVar1)) {
    pVVar4 = __ptr->pArray;
    uVar10 = 0;
    do {
      if (pVVar4[uVar10].nSize != 1) {
        printf(" %4d : {",uVar10 & 0xffffffff);
        if (0 < pVVar4[uVar10].nSize) {
          lVar12 = 0;
          do {
            printf(" %d",(ulong)(uint)pVVar4[uVar10].pArray[lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar4[uVar10].nSize);
        }
        puts(" }");
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar1);
  }
  if (pvPosEquivs != (Vec_Ptr_t **)0x0) {
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    uVar9 = 8;
    if (6 < uVar1 - 1) {
      uVar9 = uVar1;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = uVar9;
    if (uVar9 == 0) {
      __ptr_00 = (void **)0x0;
    }
    else {
      __ptr_00 = (void **)malloc((long)(int)uVar9 << 3);
    }
    pVVar7->pArray = __ptr_00;
    if (0 < (int)uVar1) {
      lVar12 = 1;
      lVar11 = 0;
      do {
        pVVar4 = __ptr->pArray;
        piVar5 = (int *)malloc(0x10);
        iVar2 = *(int *)((long)pVVar4 + lVar12 * 8 + -4);
        lVar13 = (long)iVar2;
        piVar5[1] = iVar2;
        *piVar5 = iVar2;
        if (lVar13 == 0) {
          pvVar8 = (void *)0x0;
        }
        else {
          pvVar8 = malloc(lVar13 * 4);
        }
        *(void **)(piVar5 + 2) = pvVar8;
        memcpy(pvVar8,*(void **)(&pVVar4->nCap + lVar12 * 2),lVar13 << 2);
        if ((uint)lVar11 == uVar9) {
          if ((int)uVar9 < 0x10) {
            if (__ptr_00 == (void **)0x0) {
              __ptr_00 = (void **)malloc(0x80);
            }
            else {
              __ptr_00 = (void **)realloc(__ptr_00,0x80);
            }
            uVar9 = 0x10;
          }
          else {
            uVar1 = uVar9 * 2;
            if (SBORROW4(uVar9,uVar1) != 0 < (int)uVar9) {
              uVar9 = uVar1;
              if (__ptr_00 == (void **)0x0) {
                __ptr_00 = (void **)malloc((ulong)uVar1 << 3);
              }
              else {
                __ptr_00 = (void **)realloc(__ptr_00,(ulong)uVar1 << 3);
              }
            }
          }
        }
        __ptr_00[lVar11] = piVar5;
        lVar11 = lVar11 + 1;
        lVar12 = lVar12 + 2;
      } while (lVar11 < __ptr->nSize);
      pVVar7->nSize = (int)lVar11;
      pVVar7->nCap = uVar9;
      pVVar7->pArray = __ptr_00;
    }
    *pvPosEquivs = pVVar7;
  }
  iVar2 = __ptr->nCap;
  if (0 < (long)iVar2) {
    pVVar4 = __ptr->pArray;
    lVar12 = 0;
    do {
      pvVar8 = *(void **)((long)&pVVar4->pArray + lVar12);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
        *(undefined8 *)((long)&pVVar4->pArray + lVar12) = 0;
      }
      lVar12 = lVar12 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar12);
  }
  if (__ptr->pArray != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (Vec_Int_t *)0x0;
  }
  __ptr->nCap = 0;
  __ptr->nSize = 0;
  free(__ptr);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManIsoStrashReduce( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    Vec_Wec_t * vSupps = Gia_ManCreateCoSupps( p, fVerbose );
    Vec_Wec_t * vPosEquivs = Gia_ManIsoStrashReduceInt( p, vSupps, fVerbose );
    // find the first outputs and derive GIA
    Vec_Int_t * vFirsts = Vec_WecCollectFirsts( vPosEquivs );
    Gia_Man_t * pNew = Gia_ManDupCones( p, Vec_IntArray(vFirsts), Vec_IntSize(vFirsts), 0 );
    Vec_IntFree( vFirsts );
    Vec_WecFree( vSupps );
    // report and return    
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vPosEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vPosEquivs );
    Vec_WecFree( vPosEquivs );
    return pNew;
}